

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

json * __thiscall argo::json::operator[](json *this,char *name)

{
  json *pjVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,name,&local_31);
  pjVar1 = operator[](this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pjVar1;
}

Assistant:

json &json::operator[](const char *name)
{
    return (*this)[string(name)];
}